

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.h
# Opt level: O0

mz_bool mz_zip_reader_is_file_a_directory(mz_zip_archive *pZip,mz_uint file_index)

{
  mz_uint8 *p;
  mz_uint external_attr;
  mz_uint attribute_mapping_id;
  mz_uint filename_len;
  mz_uint file_index_local;
  mz_zip_archive *pZip_local;
  long local_10;
  
  if (((pZip == (mz_zip_archive *)0x0) || (pZip->m_pState == (mz_zip_internal_state *)0x0)) ||
     (pZip->m_total_files <= file_index)) {
    local_10 = 0;
  }
  else {
    local_10 = (long)(pZip->m_pState->m_central_dir).m_p +
               (ulong)*(uint *)((long)(pZip->m_pState->m_central_dir_offsets).m_p +
                               (ulong)file_index * 4);
  }
  if (local_10 == 0) {
    if (pZip != (mz_zip_archive *)0x0) {
      pZip->m_last_error = MZ_ZIP_INVALID_PARAMETER;
    }
    pZip_local._0_4_ = 0;
  }
  else if ((*(ushort *)(local_10 + 0x1c) == 0) ||
          (*(char *)(local_10 + 0x2d + (ulong)(uint)*(ushort *)(local_10 + 0x1c)) != '/')) {
    if ((*(byte *)(local_10 + 0x26) & 0x10) == 0) {
      pZip_local._0_4_ = 0;
    }
    else {
      pZip_local._0_4_ = 1;
    }
  }
  else {
    pZip_local._0_4_ = 1;
  }
  return (mz_bool)pZip_local;
}

Assistant:

mz_bool mz_zip_reader_is_file_a_directory(mz_zip_archive *pZip,
                                          mz_uint file_index) {
  mz_uint filename_len, attribute_mapping_id, external_attr;
  const mz_uint8 *p = mz_zip_get_cdh(pZip, file_index);
  if (!p) {
    mz_zip_set_error(pZip, MZ_ZIP_INVALID_PARAMETER);
    return MZ_FALSE;
  }

  filename_len = MZ_READ_LE16(p + MZ_ZIP_CDH_FILENAME_LEN_OFS);
  if (filename_len) {
    if (*(p + MZ_ZIP_CENTRAL_DIR_HEADER_SIZE + filename_len - 1) == '/')
      return MZ_TRUE;
  }

  /* Bugfix: This code was also checking if the internal attribute was non-zero,
   * which wasn't correct. */
  /* Most/all zip writers (hopefully) set DOS file/directory attributes in the
   * low 16-bits, so check for the DOS directory flag and ignore the source OS
   * ID in the created by field. */
  /* FIXME: Remove this check? Is it necessary - we already check the filename.
   */
  attribute_mapping_id = MZ_READ_LE16(p + MZ_ZIP_CDH_VERSION_MADE_BY_OFS) >> 8;
  (void)attribute_mapping_id;

  external_attr = MZ_READ_LE32(p + MZ_ZIP_CDH_EXTERNAL_ATTR_OFS);
  if ((external_attr & MZ_ZIP_DOS_DIR_ATTRIBUTE_BITFLAG) != 0) {
    return MZ_TRUE;
  }

  return MZ_FALSE;
}